

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

int __thiscall google::protobuf::FieldOptions::ByteSize(FieldOptions *this)

{
  byte bVar1;
  string *psVar2;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  
  bVar1 = (byte)this->_has_bits_[0];
  if (bVar1 == 0) {
    iVar4 = 0;
  }
  else {
    iVar4 = 0;
    if ((bVar1 & 1) != 0) {
      uVar6 = this->ctype_;
      if ((int)uVar6 < 0) {
        iVar4 = 0xb;
      }
      else {
        iVar4 = 2;
        if (0x7f < uVar6) {
          iVar4 = io::CodedOutputStream::VarintSize32Fallback(uVar6);
          iVar4 = iVar4 + 1;
        }
      }
    }
    uVar6 = this->_has_bits_[0];
    iVar4 = (uVar6 >> 2 & 2) + (uVar6 >> 1 & 2) + (uVar6 & 2) + iVar4;
    if ((uVar6 & 0x10) != 0) {
      psVar2 = this->experimental_map_key_;
      uVar6 = (uint)psVar2->_M_string_length;
      iVar5 = 1;
      if (0x7f < uVar6) {
        iVar5 = io::CodedOutputStream::VarintSize32Fallback(uVar6);
      }
      iVar4 = iVar4 + iVar5 + (int)psVar2->_M_string_length + 1;
    }
    iVar4 = (this->_has_bits_[0] >> 4 & 2) + iVar4;
  }
  iVar5 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
  iVar4 = iVar4 + iVar5 * 2;
  if (0 < iVar5) {
    lVar7 = 0;
    do {
      uVar6 = UninterpretedOption::ByteSize
                        ((UninterpretedOption *)
                         (this->uninterpreted_option_).super_RepeatedPtrFieldBase.elements_[lVar7]);
      iVar5 = 1;
      if (0x7f < uVar6) {
        iVar5 = io::CodedOutputStream::VarintSize32Fallback(uVar6);
      }
      iVar4 = iVar4 + uVar6 + iVar5;
      lVar7 = lVar7 + 1;
    } while (lVar7 < (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_);
  }
  iVar5 = internal::ExtensionSet::ByteSize(&this->_extensions_);
  iVar5 = iVar5 + iVar4;
  pvVar3 = (this->_unknown_fields_).fields_;
  if ((pvVar3 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar3->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar3->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    iVar4 = internal::WireFormat::ComputeUnknownFieldsSize(&this->_unknown_fields_);
    iVar5 = iVar5 + iVar4;
  }
  this->_cached_size_ = iVar5;
  return iVar5;
}

Assistant:

int FieldOptions::ByteSize() const {
  int total_size = 0;

  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    // optional .google.protobuf.FieldOptions.CType ctype = 1 [default = STRING];
    if (has_ctype()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->ctype());
    }

    // optional bool packed = 2;
    if (has_packed()) {
      total_size += 1 + 1;
    }

    // optional bool lazy = 5 [default = false];
    if (has_lazy()) {
      total_size += 1 + 1;
    }

    // optional bool deprecated = 3 [default = false];
    if (has_deprecated()) {
      total_size += 1 + 1;
    }

    // optional string experimental_map_key = 9;
    if (has_experimental_map_key()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->experimental_map_key());
    }

    // optional bool weak = 10 [default = false];
    if (has_weak()) {
      total_size += 1 + 1;
    }

  }
  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  total_size += 2 * this->uninterpreted_option_size();
  for (int i = 0; i < this->uninterpreted_option_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->uninterpreted_option(i));
  }

  total_size += _extensions_.ByteSize();

  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}